

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointMotor.cpp
# Opt level: O0

void __thiscall btMultiBodyJointMotor::finalizeMultiDof(btMultiBodyJointMotor *this)

{
  uint uVar1;
  btMultibodyLink *pbVar2;
  btScalar *pbVar3;
  long in_RDI;
  uint offset;
  int linkDoF;
  int index;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar4;
  
  btMultiBodyConstraint::allocateJacobiansMultiDof
            ((btMultiBodyConstraint *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0))
  ;
  iVar4 = 0;
  index = (int)((ulong)in_RDI >> 0x20);
  pbVar2 = btMultiBody::getLink((btMultiBody *)(ulong)in_stack_fffffffffffffff0,index);
  uVar1 = pbVar2->m_dofOffset + iVar4 + 6;
  pbVar3 = btMultiBodyConstraint::jacobianA((btMultiBodyConstraint *)CONCAT44(iVar4,uVar1),index);
  pbVar3[uVar1] = 1.0;
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x28);
  return;
}

Assistant:

void btMultiBodyJointMotor::finalizeMultiDof()
{
	allocateJacobiansMultiDof();
	// note: we rely on the fact that data.m_jacobians are
	// always initialized to zero by the Constraint ctor
	int linkDoF = 0;
	unsigned int offset = 6 + (m_bodyA->getLink(m_linkA).m_dofOffset + linkDoF);

	// row 0: the lower bound
	// row 0: the lower bound
	jacobianA(0)[offset] = 1;

	m_numDofsFinalized = m_jacSizeBoth;
}